

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_traffic_class.hpp
# Opt level: O0

void libtorrent::aux::set_traffic_class<libtorrent::aux::udp_socket>
               (udp_socket *s,int v,error_code *ec)

{
  udp_socket *puVar1;
  bool bVar2;
  type_of_service local_44;
  traffic_class local_40;
  endpoint local_3c;
  error_code *local_20;
  error_code *ec_local;
  udp_socket *puStack_10;
  int v_local;
  udp_socket *s_local;
  
  local_20 = ec;
  ec_local._4_4_ = v;
  puStack_10 = s;
  udp_socket::local_endpoint(&local_3c,s,ec);
  bVar2 = is_v6<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>(&local_3c);
  puVar1 = puStack_10;
  if (bVar2) {
    traffic_class::traffic_class(&local_40,ec_local._4_4_ & 0xfc);
    udp_socket::set_option<libtorrent::traffic_class>(puVar1,&local_40,local_20);
  }
  else {
    bVar2 = boost::system::error_code::operator_cast_to_bool(local_20);
    puVar1 = puStack_10;
    if (!bVar2) {
      type_of_service::type_of_service(&local_44,ec_local._4_4_ & 0xfc);
      udp_socket::set_option<libtorrent::type_of_service>(puVar1,&local_44,local_20);
    }
  }
  return;
}

Assistant:

void set_traffic_class(Socket& s, int v, error_code& ec)
	{
#ifdef IP_DSCP_TRAFFIC_TYPE
		s.set_option(dscp_traffic_type((v & 0xff) >> 2), ec);
		if (!ec) return;
		ec.clear();
#endif
#if defined IPV6_TCLASS
		if (is_v6(s.local_endpoint(ec)))
			s.set_option(traffic_class(v & 0xfc), ec);
		else if (!ec)
#endif
			s.set_option(type_of_service(v & 0xfc), ec);
	}